

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

int Gia_ManCountPisWithFanout(Gia_Man_t *p)

{
  byte *pbVar1;
  undefined1 *puVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  long lVar6;
  Vec_Int_t *pVVar7;
  long lVar8;
  ulong uVar9;
  ulong *puVar10;
  
  pVVar7 = p->vCis;
  if (0 < pVVar7->nSize) {
    lVar6 = 0;
    do {
      iVar5 = pVVar7->pArray[lVar6];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_00246099;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      puVar2 = &p->pObjs[iVar5].field_0x3;
      *puVar2 = *puVar2 & 0xbf;
      lVar6 = lVar6 + 1;
      pVVar7 = p->vCis;
    } while (lVar6 < pVVar7->nSize);
  }
  iVar5 = p->nObjs;
  if (0 < iVar5) {
    lVar6 = 0;
    lVar8 = 0;
    do {
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar9 = *(ulong *)(&pGVar4->field_0x0 + lVar6) & 0x1fffffff;
      if (uVar9 != 0x1fffffff && -1 < (int)*(ulong *)(&pGVar4->field_0x0 + lVar6)) {
        pbVar1 = (byte *)((long)pGVar4 + (ulong)(uint)((int)uVar9 << 2) * -3 + lVar6 + 3);
        *pbVar1 = *pbVar1 | 0x40;
        puVar10 = (ulong *)((long)pGVar4 +
                           (ulong)((*(uint *)(&pGVar4->field_0x4 + lVar6) & 0x1fffffff) << 2) * -3 +
                           lVar6);
        *puVar10 = *puVar10 | 0x40000000;
        iVar5 = p->nObjs;
      }
      lVar8 = lVar8 + 1;
      lVar6 = lVar6 + 0xc;
    } while (lVar8 < iVar5);
  }
  pVVar7 = p->vCos;
  if (0 < pVVar7->nSize) {
    lVar6 = 0;
    do {
      iVar5 = pVVar7->pArray[lVar6];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_00246099;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p->pObjs + iVar5;
      *(ulong *)(pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)) =
           *(ulong *)(pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)) | 0x40000000;
      lVar6 = lVar6 + 1;
      pVVar7 = p->vCos;
    } while (lVar6 < pVVar7->nSize);
  }
  lVar6 = (long)p->vCis->nSize;
  if (lVar6 < 1) {
    iVar5 = 0;
    if (p->nObjs < 1) {
      return 0;
    }
  }
  else {
    lVar8 = 0;
    iVar5 = 0;
    do {
      iVar3 = p->vCis->pArray[lVar8];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) {
LAB_00246099:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      iVar5 = iVar5 + (uint)((*(uint *)(p->pObjs + iVar3) >> 0x1e & 1) != 0);
      lVar8 = lVar8 + 1;
    } while (lVar6 != lVar8);
  }
  lVar6 = 0;
  lVar8 = 0;
  do {
    if (p->pObjs == (Gia_Obj_t *)0x0) {
      return iVar5;
    }
    pbVar1 = &p->pObjs->field_0x3 + lVar6;
    *pbVar1 = *pbVar1 & 0xbf;
    lVar8 = lVar8 + 1;
    lVar6 = lVar6 + 0xc;
  } while (lVar8 < p->nObjs);
  return iVar5;
}

Assistant:

int Gia_ManCountPisWithFanout( Gia_Man_t * p )
{
    Gia_Obj_t * pObj; 
    int i, Count = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->fMark0 = 0;
    Gia_ManForEachAnd( p, pObj, i )
    {
        Gia_ObjFanin0(pObj)->fMark0 = 1;
        Gia_ObjFanin1(pObj)->fMark0 = 1;
    }
    Gia_ManForEachCo( p, pObj, i )
        Gia_ObjFanin0(pObj)->fMark0 = 1;
    Gia_ManForEachCi( p, pObj, i )
        Count += pObj->fMark0;
    Gia_ManForEachObj( p, pObj, i )
        pObj->fMark0 = 0;
    return Count;
}